

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall Inject::default_impl::test_method(default_impl *this)

{
  element_type *peVar1;
  int iVar2;
  ptr_type *ppVar3;
  undefined4 extraout_var;
  component<Inject::impl1> y;
  implemented_by<Inject::impl1,_(inject::component_scope)0> xx;
  component<Inject::service> x;
  injected<Inject::service> first;
  injected<Inject::service> second;
  _Base_ptr local_180;
  char *local_178;
  char *local_170;
  shared_count sStack_168;
  _Base_ptr local_160;
  provides<Inject::service> yy;
  _Base_ptr local_150;
  undefined **local_148;
  size_t local_140;
  shared_count sStack_138;
  _Base_ptr *local_130;
  _Base_ptr *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  _Base_ptr **local_b8;
  char *local_b0;
  char *local_a8;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::implemented_by(&xx);
  inject::context<0>::component<Inject::impl1>::component(&y);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&yy);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&first);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x129);
  second._ptr.pn.pi_._0_1_ = 0;
  second._ptr.px = (element_type *)&PTR__lazy_ostream_00163f68;
  ppVar3 = inject::context<0>::injected<Inject::service>::ptr(&first);
  iVar2 = (**ppVar3->px->_vptr_service)();
  local_180 = (_Base_ptr)CONCAT44(extraout_var,iVar2);
  local_160 = (_Base_ptr)inject::id_of<Inject::impl1>::id();
  local_178 = (char *)CONCAT71(local_178._1_7_,(_Base_ptr)CONCAT44(extraout_var,iVar2) == local_160)
  ;
  local_150 = (_Base_ptr)&local_160;
  local_170 = (char *)0x0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_a8 = "";
  local_128 = &local_180;
  local_b8 = &local_128;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00163fb8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_140 = local_140 & 0xffffffffffffff00;
  local_148 = &PTR__lazy_ostream_00163fb8;
  sStack_138.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_178,&second,&local_b0,0x129,1,2,2,"first->id()",&local_d0,"id_of<impl1>::id()",
             &local_148);
  boost::detail::shared_count::~shared_count(&sStack_168);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)&second);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x12d);
  ppVar3 = inject::context<0>::injected<Inject::service>::ptr(&first);
  peVar1 = ppVar3->px;
  ppVar3 = inject::context<0>::injected<Inject::service>::ptr(&second);
  local_148 = (undefined **)CONCAT71(local_148._1_7_,peVar1 != ppVar3->px);
  local_140 = 0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_178 = "first.get() != second.get()";
  local_170 = "";
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_00163ff8;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_118 = "";
  local_b8 = (_Base_ptr **)&local_178;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_138);
  boost::detail::shared_count::~shared_count(&second._ptr.pn);
  boost::detail::shared_count::~shared_count(&first._ptr.pn);
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = c._parent;
  inject::context<0>::current()::_current = c._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c._bindings._M_t);
  inject::context<0>::component<Inject::impl1>::~component(&y);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::~implemented_by(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(default_impl)
{
    context<>::component<service> x;
    context<>::component<service>::implemented_by<impl1> xx;

    context<>::component<impl1> y;
    context<>::component<impl1>::provides<service> yy;

    context<> c;

    context<>::injected<service> first;
    BOOST_CHECK_EQUAL(first->id(), id_of<impl1>::id());

    // check that default scope is scope_none (not singleton)
    context<>::injected<service> second;
    BOOST_CHECK(first.get() != second.get());
}